

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_EndpointUrl_split(char *endpointUrl,char *hostname,UA_UInt16 *port,char **path)

{
  uint local_64;
  ulong uStack_60;
  UA_UInt32 p;
  size_t i;
  size_t portLen;
  undefined1 auStack_44 [2];
  char portStr [6];
  UA_StatusCode retval;
  char *pathTmp;
  char *portTmp;
  char **path_local;
  UA_UInt16 *port_local;
  char *hostname_local;
  char *endpointUrl_local;
  
  pathTmp = (char *)0x0;
  stack0xffffffffffffffc0 = 0;
  portTmp = (char *)path;
  path_local = (char **)port;
  port_local = (UA_UInt16 *)hostname;
  hostname_local = endpointUrl;
  _auStack_44 = UA_EndpointUrl_split_ptr(endpointUrl,hostname,&pathTmp,(char **)(portStr + 2));
  if (_auStack_44 == 0) {
    if ((path_local == (char **)0x0) && (portTmp == (char *)0x0)) {
      endpointUrl_local._4_4_ = 0;
    }
    else {
      portLen._6_1_ = 0;
      if (pathTmp == (char *)0x0) {
        if (path_local != (char **)0x0) {
          *(undefined2 *)path_local = 0;
        }
      }
      else {
        if (stack0xffffffffffffffc0 == 0) {
          i = strlen(pathTmp);
        }
        else {
          i = stack0xffffffffffffffc0 + (-1 - (long)pathTmp);
        }
        if (5 < i) {
          return 0x803c0000;
        }
        memcpy((void *)((long)&portLen + 6),pathTmp,i);
        *(undefined1 *)((long)&portLen + i + 6) = 0;
        if (path_local != (char **)0x0) {
          for (uStack_60 = 0; (uStack_60 < 6 && (*(char *)((long)&portLen + uStack_60 + 6) != '\0'))
              ; uStack_60 = uStack_60 + 1) {
            if ((*(char *)((long)&portLen + uStack_60 + 6) < '0') ||
               ('9' < *(char *)((long)&portLen + uStack_60 + 6))) {
              return 0x803c0000;
            }
          }
          UA_readNumber((UA_Byte *)((long)&portLen + 6),6,&local_64);
          if (0xffff < local_64) {
            return 0x803c0000;
          }
          *(short *)path_local = (short)local_64;
        }
      }
      if (portTmp != (char *)0x0) {
        *(long *)portTmp = stack0xffffffffffffffc0;
      }
      endpointUrl_local._4_4_ = 0;
    }
  }
  else {
    endpointUrl_local._4_4_ = _auStack_44;
    if (port_local != (UA_UInt16 *)0x0) {
      *(undefined1 *)port_local = 0;
    }
  }
  return endpointUrl_local._4_4_;
}

Assistant:

UA_StatusCode
UA_EndpointUrl_split(const char *endpointUrl, char *hostname,
                     UA_UInt16 * port, const char ** path) {
    const char* portTmp = NULL;
    const char* pathTmp = NULL;
    UA_StatusCode retval = UA_EndpointUrl_split_ptr(endpointUrl, hostname, &portTmp, &pathTmp);
    if(retval != UA_STATUSCODE_GOOD) {
        if(hostname)
            hostname[0] = '\0';
        return retval;
    }
    if(!port && !path)
        return UA_STATUSCODE_GOOD;

    char portStr[6];
    portStr[0] = '\0';
    if(portTmp) {
        size_t portLen;
        if (pathTmp)
            portLen = (size_t)(pathTmp-portTmp-1);
        else
            portLen = strlen(portTmp);

        if (portLen > 5) // max is 65535
            return UA_STATUSCODE_BADOUTOFRANGE;

        memcpy(portStr, portTmp, portLen);
        portStr[portLen]='\0';

        if(port) {
            for (size_t i=0; i<6; ++i) {
                if (portStr[i] == 0)
                    break;
                if (portStr[i] < '0' || portStr[i] > '9')
                    return UA_STATUSCODE_BADOUTOFRANGE;
            }

            UA_UInt32 p;
            UA_readNumber((UA_Byte*)portStr, 6, &p);
            if (p>65535)
                return UA_STATUSCODE_BADOUTOFRANGE;
            *port = (UA_UInt16)p;
        }
    } else {
        if (port)
            *port = 0;
    }
    if (path)
        *path = pathTmp;
    return UA_STATUSCODE_GOOD;
}